

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9skin.cpp
# Opt level: O0

void * rw::d3d9::skinOpen(void *o,int32 param_2,int32 param_3)

{
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  _DAT_00168c30 = makeSkinPipeline();
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
#ifdef RW_D3D9
	createSkinShaders();
#endif

	skinGlobals.pipelines[PLATFORM_D3D9] = makeSkinPipeline();
	return o;
}